

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
               (CodedInputStream *input,RepeatedField<long> *values)

{
  bool bVar1;
  Limit limit;
  int iVar2;
  int length;
  long value;
  int local_2c;
  int64 local_28;
  
  bVar1 = io::CodedInputStream::ReadVarintSizeAsInt(input,&local_2c);
  if (bVar1) {
    limit = io::CodedInputStream::PushLimit(input,local_2c);
    while( true ) {
      iVar2 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar2 < 1) break;
      bVar1 = ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                        (input,&local_28);
      if (!bVar1) goto LAB_001705fd;
      RepeatedField<long>::Add(values,&local_28);
    }
    io::CodedInputStream::PopLimit(input,limit);
    bVar1 = true;
  }
  else {
LAB_001705fd:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadPackedPrimitive(io::CodedInputStream* input,
                                                RepeatedField<CType>* values) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    CType value;
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->Add(value);
  }
  input->PopLimit(limit);
  return true;
}